

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::cpp::Int64ToString(string *macro_prefix,int64 number)

{
  long in_RDX;
  AlphaNum *in_RDI;
  AlphaNum *pAVar1;
  AlphaNum *in_stack_ffffffffffffff20;
  AlphaNum *in_stack_ffffffffffffff28;
  AlphaNum *in_stack_ffffffffffffff30;
  AlphaNum *in_stack_ffffffffffffff38;
  
  pAVar1 = in_RDI;
  if (in_RDX == -0x8000000000000000) {
    strings::AlphaNum::AlphaNum(in_RDI,(string *)in_RDI);
    strings::AlphaNum::AlphaNum(pAVar1,(char *)in_RDI);
    strings::AlphaNum::AlphaNum(pAVar1,(long)in_RDI);
    strings::AlphaNum::AlphaNum(pAVar1,(char *)in_RDI);
    StrCat_abi_cxx11_(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                      in_stack_ffffffffffffff20);
  }
  else {
    strings::AlphaNum::AlphaNum(in_RDI,(string *)in_RDI);
    strings::AlphaNum::AlphaNum(pAVar1,(char *)in_RDI);
    strings::AlphaNum::AlphaNum(pAVar1,(long)in_RDI);
    strings::AlphaNum::AlphaNum(pAVar1,(char *)in_RDI);
    StrCat_abi_cxx11_(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                      in_stack_ffffffffffffff20);
  }
  return (string *)pAVar1;
}

Assistant:

std::string Int64ToString(const std::string& macro_prefix, int64 number) {
  if (number == kint64min) {
    // This needs to be special-cased, see explanation here:
    // https://gcc.gnu.org/bugzilla/show_bug.cgi?id=52661
    return StrCat(macro_prefix, "_LONGLONG(", number + 1, ") - 1");
  }
  return StrCat(macro_prefix, "_LONGLONG(", number, ")");
}